

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_decompressSequencesSplitLitBuffer
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset)

{
  byte bVar1;
  byte bVar2;
  undefined8 uVar3;
  seq_t sequence;
  seq_t sequence_00;
  seq_t sequence_01;
  U32 i;
  size_t sVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  ulong *puVar8;
  size_t __n;
  ulong uVar9;
  BYTE *pBVar10;
  int iVar11;
  int iVar12;
  BYTE *pBVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  BYTE *oend;
  void *pvVar17;
  ulong uVar18;
  BYTE *pBVar19;
  BYTE *pBVar20;
  int local_10c;
  BYTE *local_108;
  ulong local_100;
  BYTE *local_f8;
  BIT_DStream_t local_f0;
  ZSTD_fseState local_c8;
  ZSTD_fseState local_b8;
  ZSTD_fseState local_a8;
  ulong local_98 [3];
  BYTE *local_80 [4];
  ulong local_60;
  ulong local_58;
  size_t sStack_50;
  ulong local_48;
  BYTE *local_40;
  void *local_38;
  
  if (dctx->bmi2 != 0) {
    sVar4 = ZSTD_decompressSequencesSplitLitBuffer_bmi2
                      (dctx,dst,maxDstSize,seqStart,seqSize,nbSeq,isLongOffset);
    return sVar4;
  }
  sVar4 = 0;
  if (0 < (long)maxDstSize) {
    sVar4 = maxDstSize;
  }
  local_108 = dctx->litPtr;
  local_f8 = dctx->litBufferEnd;
  pBVar20 = (BYTE *)(sVar4 + (long)dst);
  pvVar17 = dst;
  if (nbSeq == 0) {
LAB_0038d8da:
    pBVar13 = local_108;
    if (dctx->litBufferLocation == ZSTD_split) {
      __n = (long)local_f8 - (long)local_108;
      if ((ulong)((long)pBVar20 - (long)dst) < __n) {
        return 0xffffffffffffffba;
      }
      if ((BYTE *)dst == (BYTE *)0x0) {
        dst = (BYTE *)0x0;
      }
      else {
        memmove(dst,local_108,__n);
        dst = (void *)((long)dst + __n);
      }
      pBVar13 = dctx->litExtraBuffer;
      dctx->litBufferLocation = ZSTD_not_in_dst;
      local_f8 = dctx->litExtraBuffer + 0x10000;
    }
    uVar15 = (long)local_f8 - (long)pBVar13;
    sVar4 = 0xffffffffffffffba;
    if (uVar15 <= (ulong)((long)pBVar20 - (long)dst)) {
      if ((BYTE *)dst == (BYTE *)0x0) {
        pBVar20 = (BYTE *)0x0;
      }
      else {
        switchD_00332694::default(dst,pBVar13,uVar15);
        pBVar20 = (BYTE *)((long)dst + uVar15);
      }
      sVar4 = (long)pBVar20 - (long)pvVar17;
    }
  }
  else {
    local_80[1] = (BYTE *)dctx->prefixStart;
    local_80[3] = (BYTE *)dctx->virtualStart;
    local_80[2] = (BYTE *)dctx->dictEnd;
    dctx->fseEntropy = 1;
    lVar5 = -0xc;
    do {
      *(ulong *)((long)local_80 + lVar5 * 2) =
           (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar5);
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0);
    if (seqSize != 0) {
      local_f0.limitPtr = (char *)((long)seqStart + 8);
      if (seqSize < 8) {
        local_f0.bitContainer = (BitContainerType)*seqStart;
        switch(seqSize) {
        case 7:
          local_f0.bitContainer =
               local_f0.bitContainer | (ulong)*(byte *)((long)seqStart + 6) << 0x30;
        case 6:
          local_f0.bitContainer =
               local_f0.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
        case 5:
          local_f0.bitContainer =
               local_f0.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
        case 4:
          local_f0.bitContainer =
               local_f0.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
        case 3:
          local_f0.bitContainer =
               local_f0.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
        case 2:
          local_f0.bitContainer =
               (ulong)*(byte *)((long)seqStart + 1) * 0x100 + local_f0.bitContainer;
        }
        bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
        if (bVar1 != 0) {
          uVar14 = 0x1f;
          if (bVar1 != 0) {
            for (; bVar1 >> uVar14 == 0; uVar14 = uVar14 - 1) {
            }
          }
          local_f0.bitsConsumed = (uVar14 ^ 0x1f) + (int)seqSize * -8 + 0x29;
          local_f0.ptr = (char *)seqStart;
LAB_0038d9b8:
          local_f0.start = (char *)seqStart;
          local_80[0] = (BYTE *)(sVar4 + (long)dst);
          ZSTD_initFseState(&local_c8,&local_f0,dctx->LLTptr);
          ZSTD_initFseState(&local_b8,&local_f0,dctx->OFTptr);
          ZSTD_initFseState(&local_a8,&local_f0,dctx->MLTptr);
          local_38 = dst;
          local_10c = nbSeq;
          do {
            pBVar20 = local_80[1];
            uVar15 = (ulong)local_a8.table[local_a8.state].baseValue;
            uVar14 = local_c8.table[local_c8.state].baseValue;
            uVar16 = (ulong)uVar14;
            bVar1 = local_c8.table[local_c8.state].nbAdditionalBits;
            bVar7 = local_a8.table[local_a8.state].nbAdditionalBits;
            bVar2 = local_b8.table[local_b8.state].nbAdditionalBits;
            local_60 = (ulong)local_a8.table[local_a8.state].nextState;
            local_100 = (ulong)local_b8.table[local_b8.state].nextState;
            bVar6 = (byte)local_f0.bitsConsumed;
            if (bVar2 < 2) {
              if (bVar2 != 0) {
                local_f0.bitsConsumed = local_f0.bitsConsumed + 1;
                lVar5 = (ulong)(local_b8.table[local_b8.state].baseValue + (uint)(uVar14 == 0)) -
                        ((long)(local_f0.bitContainer << (bVar6 & 0x3f)) >> 0x3f);
                if (lVar5 == 3) {
                  uVar9 = -(ulong)(local_98[0] - 1 == 0) | local_98[0] - 1;
                }
                else {
                  uVar9 = -(ulong)(local_98[lVar5] == 0) | local_98[lVar5];
                  puVar8 = local_98;
                  if (lVar5 == 1) goto LAB_0038db3c;
                }
                goto LAB_0038daf7;
              }
              uVar9 = local_98[uVar14 == 0];
              puVar8 = local_98 + (uVar14 != 0);
            }
            else {
              local_f0.bitsConsumed = local_f0.bitsConsumed + bVar2;
              uVar9 = ((local_f0.bitContainer << (bVar6 & 0x3f)) >> (-bVar2 & 0x3f)) +
                      (ulong)local_b8.table[local_b8.state].baseValue;
LAB_0038daf7:
              local_98[2] = local_98[1];
              puVar8 = local_98;
            }
LAB_0038db3c:
            local_98[1] = *puVar8;
            local_98[0] = uVar9;
            if (bVar7 != 0) {
              bVar6 = (byte)local_f0.bitsConsumed;
              local_f0.bitsConsumed = local_f0.bitsConsumed + bVar7;
              uVar15 = uVar15 + ((local_f0.bitContainer << (bVar6 & 0x3f)) >> (-bVar7 & 0x3f));
            }
            if (0x1e < (byte)(bVar7 + bVar1 + bVar2)) {
              if (local_f0.bitsConsumed < 0x41) {
                if (local_f0.ptr < local_f0.limitPtr) {
                  if (local_f0.ptr == local_f0.start) goto LAB_0038db84;
                  uVar14 = (int)local_f0.ptr - (int)local_f0.start;
                  if (local_f0.start <=
                      (ulong *)((long)local_f0.ptr - (ulong)(local_f0.bitsConsumed >> 3))) {
                    uVar14 = local_f0.bitsConsumed >> 3;
                  }
                  local_f0.bitsConsumed = local_f0.bitsConsumed + uVar14 * -8;
                }
                else {
                  uVar14 = local_f0.bitsConsumed >> 3;
                  local_f0.bitsConsumed = local_f0.bitsConsumed & 7;
                }
                local_f0.ptr = (char *)((long)local_f0.ptr - (ulong)uVar14);
                local_f0.bitContainer = *(BitContainerType *)local_f0.ptr;
              }
              else {
                local_f0.ptr = "";
              }
            }
LAB_0038db84:
            if (bVar1 != 0) {
              bVar7 = (byte)local_f0.bitsConsumed;
              local_f0.bitsConsumed = local_f0.bitsConsumed + bVar1;
              uVar16 = uVar16 + ((local_f0.bitContainer << (bVar7 & 0x3f)) >> (-bVar1 & 0x3f));
            }
            if (local_10c != 1) {
              iVar11 = local_c8.table[local_c8.state].nbBits + local_f0.bitsConsumed;
              iVar12 = iVar11 + (uint)local_a8.table[local_a8.state].nbBits;
              local_c8.state =
                   (~(-1L << (local_c8.table[local_c8.state].nbBits & 0x3f)) &
                   local_f0.bitContainer >> (-(char)iVar11 & 0x3fU)) +
                   (ulong)local_c8.table[local_c8.state].nextState;
              local_f0.bitsConsumed = iVar12 + (uint)local_b8.table[local_b8.state].nbBits;
              local_a8.state =
                   (~(-1L << (local_a8.table[local_a8.state].nbBits & 0x3f)) &
                   local_f0.bitContainer >> (-(char)iVar12 & 0x3fU)) +
                   (ulong)local_a8.table[local_a8.state].nextState;
              local_b8.state =
                   (~(-1L << (local_b8.table[local_b8.state].nbBits & 0x3f)) &
                   local_f0.bitContainer >> (-(char)local_f0.bitsConsumed & 0x3fU)) + local_100;
              if (local_f0.bitsConsumed < 0x41) {
                if (local_f0.ptr < local_f0.limitPtr) {
                  if (local_f0.ptr != local_f0.start) {
                    uVar14 = (int)local_f0.ptr - (int)local_f0.start;
                    if (local_f0.start <=
                        (ulong *)((long)local_f0.ptr - (ulong)(local_f0.bitsConsumed >> 3))) {
                      uVar14 = local_f0.bitsConsumed >> 3;
                    }
                    local_f0.ptr = (char *)((long)local_f0.ptr - (ulong)uVar14);
                    local_f0.bitsConsumed = local_f0.bitsConsumed + uVar14 * -8;
                    local_f0.bitContainer = *(BitContainerType *)local_f0.ptr;
                  }
                }
                else {
                  local_f0.ptr = (char *)((long)local_f0.ptr - (ulong)(local_f0.bitsConsumed >> 3));
                  local_f0.bitsConsumed = local_f0.bitsConsumed & 7;
                  local_f0.bitContainer = *(BitContainerType *)local_f0.ptr;
                }
              }
              else {
                local_f0.ptr = "";
              }
              pBVar13 = dctx->litBufferEnd;
              if (local_108 + uVar16 <= pBVar13) goto LAB_0038dcf9;
              if (local_10c < 1) break;
LAB_0038e121:
              uVar18 = (long)pBVar13 - (long)local_108;
              if (uVar18 != 0) {
                if ((ulong)((long)local_80[0] - (long)dst) < uVar18) {
                  return 0xffffffffffffffba;
                }
                ZSTD_safecopyDstBeforeSrc((BYTE *)dst,local_108,uVar18);
                uVar16 = uVar16 - uVar18;
                dst = (void *)((long)dst + uVar18);
              }
              pBVar20 = local_80[1];
              local_108 = dctx->litExtraBuffer;
              local_f8 = dctx->litExtraBuffer + 0x10000;
              dctx->litBufferLocation = ZSTD_not_in_dst;
              local_40 = local_80[0] + -0x20;
              if (((long)uVar16 < 0x10001) &&
                 (uVar18 = uVar15 + uVar16, (BYTE *)((long)dst + uVar18) <= local_80[0] + -0x20)) {
                pBVar13 = (BYTE *)((long)dst + uVar16);
                pBVar19 = dctx->litExtraBuffer + uVar16;
                uVar3 = *(undefined8 *)(dctx->litExtraBuffer + 8);
                *(undefined8 *)dst = *(undefined8 *)local_108;
                *(undefined8 *)((long)dst + 8) = uVar3;
                if (0x10 < uVar16) {
                  uVar3 = *(undefined8 *)(dctx->litExtraBuffer + 0x18);
                  *(undefined8 *)((long)dst + 0x10) = *(undefined8 *)(dctx->litExtraBuffer + 0x10);
                  *(undefined8 *)((long)dst + 0x18) = uVar3;
                  if (0x10 < (long)(uVar16 - 0x10)) {
                    lVar5 = 0;
                    do {
                      uVar3 = *(undefined8 *)(dctx->litExtraBuffer + lVar5 + 0x20 + 8);
                      pBVar10 = (BYTE *)((long)dst + lVar5 + 0x20);
                      *(undefined8 *)pBVar10 = *(undefined8 *)(dctx->litExtraBuffer + lVar5 + 0x20);
                      *(undefined8 *)(pBVar10 + 8) = uVar3;
                      uVar3 = *(undefined8 *)(dctx->litExtraBuffer + lVar5 + 0x30 + 8);
                      *(undefined8 *)(pBVar10 + 0x10) =
                           *(undefined8 *)(dctx->litExtraBuffer + lVar5 + 0x30);
                      *(undefined8 *)(pBVar10 + 0x18) = uVar3;
                      lVar5 = lVar5 + 0x20;
                    } while (pBVar10 + 0x20 < pBVar13);
                  }
                }
                pBVar10 = pBVar13 + -uVar9;
                local_108 = pBVar19;
                if ((ulong)((long)pBVar13 - (long)local_80[1]) < uVar9) {
                  if (uVar9 <= (ulong)((long)pBVar13 - (long)local_80[3])) {
                    lVar5 = (long)(pBVar13 + -uVar9) - (long)local_80[1];
                    pBVar19 = local_80[2] + lVar5;
                    local_100 = uVar18;
                    if (local_80[2] < pBVar19 + uVar15) {
                      memmove(pBVar13,pBVar19,-lVar5);
                      pBVar13 = pBVar13 + -lVar5;
                      uVar15 = uVar15 + lVar5;
                      uVar18 = local_100;
                      pBVar10 = pBVar20;
                      goto LAB_0038e254;
                    }
                    memmove(pBVar13,pBVar19,uVar15);
                    uVar18 = local_100;
                    goto LAB_0038e2ab;
                  }
                  break;
                }
LAB_0038e254:
                if (uVar9 < 0x10) {
                  if (uVar9 < 8) {
                    iVar11 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                      ::dec64table + uVar9 * 4);
                    *pBVar13 = *pBVar10;
                    pBVar13[1] = pBVar10[1];
                    pBVar13[2] = pBVar10[2];
                    pBVar13[3] = pBVar10[3];
                    pBVar20 = pBVar10 + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar9 * 4);
                    pBVar10 = pBVar10 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar9 * 4) - (long)iVar11);
                    *(undefined4 *)(pBVar13 + 4) = *(undefined4 *)pBVar20;
                  }
                  else {
                    *(undefined8 *)pBVar13 = *(undefined8 *)pBVar10;
                  }
                  if (8 < uVar15) {
                    pBVar20 = pBVar10 + 8;
                    pBVar19 = pBVar13 + 8;
                    if ((long)pBVar19 - (long)pBVar20 < 0x10) {
                      do {
                        *(undefined8 *)pBVar19 = *(undefined8 *)pBVar20;
                        pBVar19 = pBVar19 + 8;
                        pBVar20 = pBVar20 + 8;
                      } while (pBVar19 < pBVar13 + uVar15);
                    }
                    else {
                      uVar3 = *(undefined8 *)(pBVar10 + 0x10);
                      *(undefined8 *)pBVar19 = *(undefined8 *)pBVar20;
                      *(undefined8 *)(pBVar13 + 0x10) = uVar3;
                      if (0x18 < (long)uVar15) {
                        lVar5 = 0;
                        do {
                          uVar3 = *(undefined8 *)(pBVar10 + lVar5 + 0x18 + 8);
                          pBVar20 = pBVar13 + lVar5 + 0x18;
                          *(undefined8 *)pBVar20 = *(undefined8 *)(pBVar10 + lVar5 + 0x18);
                          *(undefined8 *)(pBVar20 + 8) = uVar3;
                          uVar3 = *(undefined8 *)(pBVar10 + lVar5 + 0x28 + 8);
                          *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)(pBVar10 + lVar5 + 0x28);
                          *(undefined8 *)(pBVar20 + 0x18) = uVar3;
                          lVar5 = lVar5 + 0x20;
                        } while (pBVar20 + 0x20 < pBVar13 + uVar15);
                      }
                    }
                  }
                }
                else {
                  uVar3 = *(undefined8 *)(pBVar10 + 8);
                  *(undefined8 *)pBVar13 = *(undefined8 *)pBVar10;
                  *(undefined8 *)(pBVar13 + 8) = uVar3;
                  if (0x10 < (long)uVar15) {
                    lVar5 = 0x10;
                    do {
                      uVar3 = *(undefined8 *)(pBVar10 + lVar5 + 8);
                      pBVar20 = pBVar13 + lVar5;
                      *(undefined8 *)pBVar20 = *(undefined8 *)(pBVar10 + lVar5);
                      *(undefined8 *)(pBVar20 + 8) = uVar3;
                      uVar3 = *(undefined8 *)(pBVar10 + lVar5 + 0x10 + 8);
                      *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)(pBVar10 + lVar5 + 0x10);
                      *(undefined8 *)(pBVar20 + 0x18) = uVar3;
                      lVar5 = lVar5 + 0x20;
                    } while (pBVar20 + 0x20 < pBVar13 + uVar15);
                  }
                }
              }
              else {
                sequence_01.matchLength = uVar15;
                sequence_01.litLength = uVar16;
                sequence_01.offset = uVar9;
                local_58 = uVar16;
                sStack_50 = uVar15;
                local_48 = uVar9;
                uVar18 = ZSTD_execSequenceEnd
                                   ((BYTE *)dst,local_80[0],sequence_01,&local_108,local_f8,
                                    local_80[1],local_80[3],local_80[2]);
              }
LAB_0038e2ab:
              if (0xffffffffffffff88 < uVar18) {
                return uVar18;
              }
              dst = (void *)((long)dst + uVar18);
              pBVar20 = local_80[1];
              uVar15 = local_58;
              if (local_10c != 1) {
                while (local_10c = local_10c + -1, local_80[1] = pBVar20, local_58 = uVar15,
                      local_10c != 0) {
                  uVar16 = (ulong)local_a8.table[local_a8.state].baseValue;
                  uVar14 = local_c8.table[local_c8.state].baseValue;
                  local_58 = (ulong)uVar14;
                  bVar1 = local_c8.table[local_c8.state].nbAdditionalBits;
                  bVar7 = local_a8.table[local_a8.state].nbAdditionalBits;
                  bVar2 = local_b8.table[local_b8.state].nbAdditionalBits;
                  local_60 = (ulong)local_a8.table[local_a8.state].nextState;
                  local_100 = (ulong)local_b8.table[local_b8.state].nextState;
                  bVar6 = (byte)local_f0.bitsConsumed;
                  if (bVar2 < 2) {
                    if (bVar2 != 0) {
                      local_f0.bitsConsumed = local_f0.bitsConsumed + 1;
                      lVar5 = (ulong)(local_b8.table[local_b8.state].baseValue + (uint)(uVar14 == 0)
                                     ) - ((long)(local_f0.bitContainer << (bVar6 & 0x3f)) >> 0x3f);
                      if (lVar5 == 3) {
                        uVar9 = -(ulong)(local_98[0] - 1 == 0) | local_98[0] - 1;
                      }
                      else {
                        uVar9 = -(ulong)(local_98[lVar5] == 0) | local_98[lVar5];
                        puVar8 = local_98;
                        if (lVar5 == 1) goto LAB_0038e40f;
                      }
                      goto LAB_0038e3ca;
                    }
                    uVar9 = local_98[uVar14 == 0];
                    puVar8 = local_98 + (uVar14 != 0);
                  }
                  else {
                    local_f0.bitsConsumed = local_f0.bitsConsumed + bVar2;
                    uVar9 = ((local_f0.bitContainer << (bVar6 & 0x3f)) >> (-bVar2 & 0x3f)) +
                            (ulong)local_b8.table[local_b8.state].baseValue;
LAB_0038e3ca:
                    local_98[2] = local_98[1];
                    puVar8 = local_98;
                  }
LAB_0038e40f:
                  local_98[1] = *puVar8;
                  local_98[0] = uVar9;
                  if (bVar7 != 0) {
                    bVar6 = (byte)local_f0.bitsConsumed;
                    local_f0.bitsConsumed = local_f0.bitsConsumed + bVar7;
                    uVar16 = uVar16 + ((local_f0.bitContainer << (bVar6 & 0x3f)) >> (-bVar7 & 0x3f))
                    ;
                  }
                  if (0x1e < (byte)(bVar7 + bVar1 + bVar2)) {
                    if (local_f0.bitsConsumed < 0x41) {
                      if (local_f0.ptr < local_f0.limitPtr) {
                        if (local_f0.ptr != local_f0.start) {
                          uVar18 = (ulong)(uint)((int)local_f0.ptr - (int)local_f0.start);
                          if (local_f0.start <=
                              (ulong *)((long)local_f0.ptr - (ulong)(local_f0.bitsConsumed >> 3))) {
                            uVar18 = (ulong)(local_f0.bitsConsumed >> 3);
                          }
                          local_f0.ptr = (char *)((long)local_f0.ptr - uVar18);
                          local_f0.bitsConsumed = local_f0.bitsConsumed + (int)uVar18 * -8;
                          local_f0.bitContainer = *(BitContainerType *)local_f0.ptr;
                        }
                      }
                      else {
                        local_f0.ptr = (char *)((long)local_f0.ptr -
                                               (ulong)(local_f0.bitsConsumed >> 3));
                        local_f0.bitsConsumed = local_f0.bitsConsumed & 7;
                        local_f0.bitContainer = *(BitContainerType *)local_f0.ptr;
                      }
                    }
                    else {
                      local_f0.ptr = "";
                    }
                  }
                  if (bVar1 != 0) {
                    bVar7 = (byte)local_f0.bitsConsumed;
                    local_f0.bitsConsumed = local_f0.bitsConsumed + bVar1;
                    local_58 = local_58 +
                               ((local_f0.bitContainer << (bVar7 & 0x3f)) >> (-bVar1 & 0x3f));
                  }
                  if (local_10c != 1) {
                    iVar11 = local_c8.table[local_c8.state].nbBits + local_f0.bitsConsumed;
                    iVar12 = iVar11 + (uint)local_a8.table[local_a8.state].nbBits;
                    local_c8.state =
                         (~(-1L << (local_c8.table[local_c8.state].nbBits & 0x3f)) &
                         local_f0.bitContainer >> (-(char)iVar11 & 0x3fU)) +
                         (ulong)local_c8.table[local_c8.state].nextState;
                    local_f0.bitsConsumed = iVar12 + (uint)local_b8.table[local_b8.state].nbBits;
                    local_a8.state =
                         (~(-1L << (local_a8.table[local_a8.state].nbBits & 0x3f)) &
                         local_f0.bitContainer >> (-(char)iVar12 & 0x3fU)) +
                         (ulong)local_a8.table[local_a8.state].nextState;
                    local_b8.state =
                         (~(-1L << (local_b8.table[local_b8.state].nbBits & 0x3f)) &
                         local_f0.bitContainer >> (-(char)local_f0.bitsConsumed & 0x3fU)) +
                         local_100;
                    if (local_f0.bitsConsumed < 0x41) {
                      if (local_f0.ptr < local_f0.limitPtr) {
                        if (local_f0.ptr != local_f0.start) {
                          uVar14 = (int)local_f0.ptr - (int)local_f0.start;
                          if (local_f0.start <=
                              (ulong *)((long)local_f0.ptr - (ulong)(local_f0.bitsConsumed >> 3))) {
                            uVar14 = local_f0.bitsConsumed >> 3;
                          }
                          local_f0.ptr = (char *)((long)local_f0.ptr - (ulong)uVar14);
                          local_f0.bitsConsumed = local_f0.bitsConsumed + uVar14 * -8;
                          local_f0.bitContainer = *(BitContainerType *)local_f0.ptr;
                        }
                      }
                      else {
                        local_f0.ptr = (char *)((long)local_f0.ptr -
                                               (ulong)(local_f0.bitsConsumed >> 3));
                        local_f0.bitsConsumed = local_f0.bitsConsumed & 7;
                        local_f0.bitContainer = *(BitContainerType *)local_f0.ptr;
                      }
                    }
                    else {
                      local_f0.ptr = "";
                    }
                  }
                  pBVar13 = local_108 + local_58;
                  if ((local_f8 < pBVar13) ||
                     (uVar18 = local_58 + uVar16, local_40 < (BYTE *)((long)dst + uVar18))) {
                    sequence_00.matchLength = uVar16;
                    sequence_00.litLength = local_58;
                    sequence_00.offset = uVar9;
                    sStack_50 = uVar16;
                    local_48 = uVar9;
                    uVar18 = ZSTD_execSequenceEnd
                                       ((BYTE *)dst,local_80[0],sequence_00,&local_108,local_f8,
                                        pBVar20,local_80[3],local_80[2]);
                  }
                  else {
                    pBVar19 = (BYTE *)((long)dst + local_58);
                    uVar3 = *(undefined8 *)(local_108 + 8);
                    *(undefined8 *)dst = *(undefined8 *)local_108;
                    *(undefined8 *)((long)dst + 8) = uVar3;
                    if (0x10 < local_58) {
                      uVar3 = *(undefined8 *)(local_108 + 0x18);
                      *(undefined8 *)((long)dst + 0x10) = *(undefined8 *)(local_108 + 0x10);
                      *(undefined8 *)((long)dst + 0x18) = uVar3;
                      if (0x10 < (long)(local_58 - 0x10)) {
                        lVar5 = 0;
                        do {
                          uVar3 = *(undefined8 *)(local_108 + lVar5 + 0x20 + 8);
                          pBVar10 = (BYTE *)((long)dst + lVar5 + 0x20);
                          *(undefined8 *)pBVar10 = *(undefined8 *)(local_108 + lVar5 + 0x20);
                          *(undefined8 *)(pBVar10 + 8) = uVar3;
                          uVar3 = *(undefined8 *)(local_108 + lVar5 + 0x30 + 8);
                          *(undefined8 *)(pBVar10 + 0x10) =
                               *(undefined8 *)(local_108 + lVar5 + 0x30);
                          *(undefined8 *)(pBVar10 + 0x18) = uVar3;
                          lVar5 = lVar5 + 0x20;
                        } while (pBVar10 + 0x20 < pBVar19);
                      }
                    }
                    pBVar10 = pBVar19 + -uVar9;
                    local_108 = pBVar13;
                    local_58 = uVar15;
                    if ((ulong)((long)pBVar19 - (long)pBVar20) < uVar9) {
                      if ((ulong)((long)pBVar19 - (long)local_80[3]) < uVar9) goto LAB_0038e9b8;
                      lVar5 = (long)(pBVar19 + -uVar9) - (long)pBVar20;
                      pBVar13 = local_80[2] + lVar5;
                      local_100 = uVar18;
                      if (pBVar13 + uVar16 <= local_80[2]) {
                        memmove(pBVar19,pBVar13,uVar16);
                        uVar18 = local_100;
                        goto LAB_0038e697;
                      }
                      memmove(pBVar19,pBVar13,-lVar5);
                      pBVar19 = pBVar19 + -lVar5;
                      uVar16 = uVar16 + lVar5;
                      pBVar10 = pBVar20;
                      uVar18 = local_100;
                    }
                    if (uVar9 < 0x10) {
                      if (uVar9 < 8) {
                        iVar11 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                          ::dec64table + uVar9 * 4);
                        *pBVar19 = *pBVar10;
                        pBVar19[1] = pBVar10[1];
                        pBVar19[2] = pBVar10[2];
                        pBVar19[3] = pBVar10[3];
                        pBVar20 = pBVar10 + *(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar9 * 4);
                        pBVar10 = pBVar10 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar9 * 4) - (long)iVar11);
                        *(undefined4 *)(pBVar19 + 4) = *(undefined4 *)pBVar20;
                      }
                      else {
                        *(undefined8 *)pBVar19 = *(undefined8 *)pBVar10;
                      }
                      if (8 < uVar16) {
                        pBVar20 = pBVar10 + 8;
                        pBVar13 = pBVar19 + 8;
                        if ((long)pBVar13 - (long)pBVar20 < 0x10) {
                          do {
                            *(undefined8 *)pBVar13 = *(undefined8 *)pBVar20;
                            pBVar13 = pBVar13 + 8;
                            pBVar20 = pBVar20 + 8;
                          } while (pBVar13 < pBVar19 + uVar16);
                        }
                        else {
                          uVar3 = *(undefined8 *)(pBVar10 + 0x10);
                          *(undefined8 *)pBVar13 = *(undefined8 *)pBVar20;
                          *(undefined8 *)(pBVar19 + 0x10) = uVar3;
                          if (0x18 < (long)uVar16) {
                            lVar5 = 0;
                            do {
                              uVar3 = *(undefined8 *)(pBVar10 + lVar5 + 0x18 + 8);
                              pBVar20 = pBVar19 + lVar5 + 0x18;
                              *(undefined8 *)pBVar20 = *(undefined8 *)(pBVar10 + lVar5 + 0x18);
                              *(undefined8 *)(pBVar20 + 8) = uVar3;
                              uVar3 = *(undefined8 *)(pBVar10 + lVar5 + 0x28 + 8);
                              *(undefined8 *)(pBVar20 + 0x10) =
                                   *(undefined8 *)(pBVar10 + lVar5 + 0x28);
                              *(undefined8 *)(pBVar20 + 0x18) = uVar3;
                              lVar5 = lVar5 + 0x20;
                            } while (pBVar20 + 0x20 < pBVar19 + uVar16);
                          }
                        }
                      }
                    }
                    else {
                      uVar3 = *(undefined8 *)(pBVar10 + 8);
                      *(undefined8 *)pBVar19 = *(undefined8 *)pBVar10;
                      *(undefined8 *)(pBVar19 + 8) = uVar3;
                      if (0x10 < (long)uVar16) {
                        lVar5 = 0x10;
                        do {
                          uVar3 = *(undefined8 *)(pBVar10 + lVar5 + 8);
                          pBVar20 = pBVar19 + lVar5;
                          *(undefined8 *)pBVar20 = *(undefined8 *)(pBVar10 + lVar5);
                          *(undefined8 *)(pBVar20 + 8) = uVar3;
                          uVar3 = *(undefined8 *)(pBVar10 + lVar5 + 0x10 + 8);
                          *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)(pBVar10 + lVar5 + 0x10);
                          *(undefined8 *)(pBVar20 + 0x18) = uVar3;
                          lVar5 = lVar5 + 0x20;
                        } while (pBVar20 + 0x20 < pBVar19 + uVar16);
                      }
                    }
                  }
LAB_0038e697:
                  if (0xffffffffffffff88 < uVar18) {
                    return uVar18;
                  }
                  dst = (void *)((long)dst + uVar18);
                  pBVar20 = local_80[1];
                  uVar15 = local_58;
                }
              }
LAB_0038e96a:
              if (local_f0.ptr != local_f0.start) break;
              if (local_f0.bitsConsumed != 0x40) {
                return 0xffffffffffffffec;
              }
              lVar5 = 0;
              do {
                (dctx->entropy).rep[lVar5] = (U32)local_98[lVar5];
                lVar5 = lVar5 + 1;
                pBVar20 = local_80[0];
                pvVar17 = local_38;
              } while (lVar5 != 3);
              goto LAB_0038d8da;
            }
            pBVar13 = dctx->litBufferEnd;
            if (pBVar13 < local_108 + uVar16) goto LAB_0038e121;
LAB_0038dcf9:
            pBVar13 = local_108 + uVar16;
            if ((pBVar13 <= local_f8) &&
               (uVar18 = uVar15 + uVar16, (BYTE *)((long)dst + uVar18) <= pBVar13 + -0x20)) {
              pBVar19 = (BYTE *)((long)dst + uVar16);
              uVar3 = *(undefined8 *)(local_108 + 8);
              *(undefined8 *)dst = *(undefined8 *)local_108;
              *(undefined8 *)((long)dst + 8) = uVar3;
              if (0x10 < uVar16) {
                uVar3 = *(undefined8 *)(local_108 + 0x18);
                *(undefined8 *)((long)dst + 0x10) = *(undefined8 *)(local_108 + 0x10);
                *(undefined8 *)((long)dst + 0x18) = uVar3;
                if (0x10 < (long)(uVar16 - 0x10)) {
                  lVar5 = 0;
                  do {
                    uVar3 = *(undefined8 *)(local_108 + lVar5 + 0x20 + 8);
                    pBVar10 = (BYTE *)((long)dst + lVar5 + 0x20);
                    *(undefined8 *)pBVar10 = *(undefined8 *)(local_108 + lVar5 + 0x20);
                    *(undefined8 *)(pBVar10 + 8) = uVar3;
                    uVar3 = *(undefined8 *)(local_108 + lVar5 + 0x30 + 8);
                    *(undefined8 *)(pBVar10 + 0x10) = *(undefined8 *)(local_108 + lVar5 + 0x30);
                    *(undefined8 *)(pBVar10 + 0x18) = uVar3;
                    lVar5 = lVar5 + 0x20;
                  } while (pBVar10 + 0x20 < pBVar19);
                }
              }
              pBVar10 = pBVar19 + -uVar9;
              local_108 = pBVar13;
              if ((ulong)((long)pBVar19 - (long)local_80[1]) < uVar9) {
                if ((ulong)((long)pBVar19 - (long)local_80[3]) < uVar9) break;
                lVar5 = (long)(pBVar19 + -uVar9) - (long)local_80[1];
                pBVar13 = local_80[2] + lVar5;
                if (pBVar13 + uVar15 <= local_80[2]) {
                  memmove(pBVar19,pBVar13,uVar15);
                  goto LAB_0038ddfe;
                }
                memmove(pBVar19,pBVar13,-lVar5);
                pBVar19 = pBVar19 + -lVar5;
                uVar15 = uVar15 + lVar5;
                pBVar10 = pBVar20;
              }
              if (uVar9 < 0x10) {
                if (uVar9 < 8) {
                  iVar11 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                    ::dec64table + uVar9 * 4);
                  *pBVar19 = *pBVar10;
                  pBVar19[1] = pBVar10[1];
                  pBVar19[2] = pBVar10[2];
                  pBVar19[3] = pBVar10[3];
                  pBVar20 = pBVar10 + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                ::dec32table + uVar9 * 4);
                  pBVar10 = pBVar10 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar9 * 4) - (long)iVar11);
                  *(undefined4 *)(pBVar19 + 4) = *(undefined4 *)pBVar20;
                }
                else {
                  *(undefined8 *)pBVar19 = *(undefined8 *)pBVar10;
                }
                if (8 < uVar15) {
                  pBVar20 = pBVar10 + 8;
                  pBVar13 = pBVar19 + 8;
                  if ((long)pBVar13 - (long)pBVar20 < 0x10) {
                    do {
                      *(undefined8 *)pBVar13 = *(undefined8 *)pBVar20;
                      pBVar13 = pBVar13 + 8;
                      pBVar20 = pBVar20 + 8;
                    } while (pBVar13 < pBVar19 + uVar15);
                  }
                  else {
                    uVar3 = *(undefined8 *)(pBVar10 + 0x10);
                    *(undefined8 *)pBVar13 = *(undefined8 *)pBVar20;
                    *(undefined8 *)(pBVar19 + 0x10) = uVar3;
                    if (0x18 < (long)uVar15) {
                      lVar5 = 0;
                      do {
                        uVar3 = *(undefined8 *)(pBVar10 + lVar5 + 0x18 + 8);
                        pBVar20 = pBVar19 + lVar5 + 0x18;
                        *(undefined8 *)pBVar20 = *(undefined8 *)(pBVar10 + lVar5 + 0x18);
                        *(undefined8 *)(pBVar20 + 8) = uVar3;
                        uVar3 = *(undefined8 *)(pBVar10 + lVar5 + 0x28 + 8);
                        *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)(pBVar10 + lVar5 + 0x28);
                        *(undefined8 *)(pBVar20 + 0x18) = uVar3;
                        lVar5 = lVar5 + 0x20;
                      } while (pBVar20 + 0x20 < pBVar19 + uVar15);
                    }
                  }
                }
              }
              else {
                uVar3 = *(undefined8 *)(pBVar10 + 8);
                *(undefined8 *)pBVar19 = *(undefined8 *)pBVar10;
                *(undefined8 *)(pBVar19 + 8) = uVar3;
                if (0x10 < (long)uVar15) {
                  lVar5 = 0x10;
                  do {
                    uVar3 = *(undefined8 *)(pBVar10 + lVar5 + 8);
                    pBVar20 = pBVar19 + lVar5;
                    *(undefined8 *)pBVar20 = *(undefined8 *)(pBVar10 + lVar5);
                    *(undefined8 *)(pBVar20 + 8) = uVar3;
                    uVar3 = *(undefined8 *)(pBVar10 + lVar5 + 0x10 + 8);
                    *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)(pBVar10 + lVar5 + 0x10);
                    *(undefined8 *)(pBVar20 + 0x18) = uVar3;
                    lVar5 = lVar5 + 0x20;
                  } while (pBVar20 + 0x20 < pBVar19 + uVar15);
                }
              }
              goto LAB_0038ddfe;
            }
            sequence.matchLength = uVar15;
            sequence.litLength = uVar16;
            sequence.offset = uVar9;
            local_58 = uVar16;
            sStack_50 = uVar15;
            local_48 = uVar9;
            uVar18 = ZSTD_execSequenceEndSplitLitBuffer
                               ((BYTE *)dst,local_80[0],pBVar13 + -0x20,sequence,&local_108,local_f8
                                ,local_80[1],local_80[3],local_80[2]);
LAB_0038ddfe:
            if (0xffffffffffffff88 < uVar18) {
              return uVar18;
            }
            dst = (void *)((long)dst + uVar18);
            local_10c = local_10c + -1;
            if (local_10c == 0) goto LAB_0038e96a;
          } while( true );
        }
      }
      else {
        local_f0.ptr = (char *)((long)seqStart + (seqSize - 8));
        local_f0.bitContainer = *(BitContainerType *)local_f0.ptr;
        if (local_f0.bitContainer >> 0x38 != 0) {
          uVar14 = 0x1f;
          bVar1 = (byte)(local_f0.bitContainer >> 0x38);
          if (bVar1 != 0) {
            for (; bVar1 >> uVar14 == 0; uVar14 = uVar14 - 1) {
            }
          }
          local_f0.bitsConsumed = ~uVar14 + 9;
          if (seqSize < 0xffffffffffffff89) goto LAB_0038d9b8;
        }
      }
    }
LAB_0038e9b8:
    sVar4 = 0xffffffffffffffec;
  }
  return sVar4;
}

Assistant:

static size_t
ZSTD_decompressSequencesSplitLitBuffer(ZSTD_DCtx* dctx, void* dst, size_t maxDstSize,
                                 const void* seqStart, size_t seqSize, int nbSeq,
                                 const ZSTD_longOffset_e isLongOffset)
{
    DEBUGLOG(5, "ZSTD_decompressSequencesSplitLitBuffer");
#if DYNAMIC_BMI2
    if (ZSTD_DCtx_get_bmi2(dctx)) {
        return ZSTD_decompressSequencesSplitLitBuffer_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
    }
#endif
    return ZSTD_decompressSequencesSplitLitBuffer_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
}